

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

int parse_der_pubkey(uchar *der,size_t len,mp_int *keyP,mp_int *keyQ,mp_int *keyG,mp_int *keyY)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  mp_int *pmVar5;
  byte *pbVar6;
  long in_RSI;
  byte *in_RDI;
  size_t length_4;
  size_t length_3;
  size_t length_2;
  size_t length_1;
  size_t length;
  uchar *end;
  undefined8 in_stack_ffffffffffffff78;
  mp_int *in_stack_ffffffffffffff80;
  mp_int *in_stack_ffffffffffffff88;
  mp_int *local_10 [2];
  
  pbVar3 = in_RDI + in_RSI;
  if ((((int)(uint)*in_RDI >> 5 & 1U) == 1) && ((*in_RDI & 0x1f) == 0x10)) {
    local_10[0] = (mp_int *)(in_RDI + 1);
    sVar4 = _parse_length((uchar **)local_10);
    if (pbVar3 < (byte *)((long)&((mp_int *)(in_RDI + 1))->used + sVar4)) {
      return 0;
    }
    if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 1) &&
       ((local_10[0]->used & 0x1f) == 0x10)) {
      in_stack_ffffffffffffff88 = (mp_int *)((long)&local_10[0]->used + 1);
      local_10[0] = in_stack_ffffffffffffff88;
      sVar4 = _parse_length((uchar **)local_10);
      if (pbVar3 < (byte *)((long)&in_stack_ffffffffffffff88->used + sVar4)) {
        return 0;
      }
      if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 0) && ((local_10[0]->used & 0x1f) == 6)
         ) {
        local_10[0] = (mp_int *)((long)&local_10[0]->used + 1);
        sVar4 = _parse_length((uchar **)local_10);
        if ((sVar4 != 7) || (iVar1 = memcmp(local_10[0],parse_der_pubkey::ansi_x9_57,7), iVar1 != 0)
           ) {
          return 0;
        }
        local_10[0] = (mp_int *)((long)&local_10[0]->alloc + 3);
      }
      if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 1) &&
         ((local_10[0]->used & 0x1f) == 0x10)) {
        in_stack_ffffffffffffff80 = (mp_int *)((long)&local_10[0]->used + 1);
        local_10[0] = in_stack_ffffffffffffff80;
        sVar4 = _parse_length((uchar **)local_10);
        if (pbVar3 < (byte *)((long)&in_stack_ffffffffffffff80->used + sVar4)) {
          return 0;
        }
        iVar1 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 0) &&
           ((local_10[0]->used & 0x1f) == 2)) {
          local_10[0] = (mp_int *)((long)&local_10[0]->used + 1);
          sVar4 = _parse_length((uchar **)local_10);
          if (pbVar3 < (byte *)((long)&local_10[0]->used + sVar4)) {
            return 0;
          }
          iVar2 = mp_read_unsigned_bin
                            (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80,iVar1);
          if (iVar2 != 0) {
            return 0;
          }
          local_10[0] = (mp_int *)((long)&local_10[0]->used + sVar4);
        }
        if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 0) &&
           ((local_10[0]->used & 0x1f) == 2)) {
          local_10[0] = (mp_int *)((long)&local_10[0]->used + 1);
          sVar4 = _parse_length((uchar **)local_10);
          if (pbVar3 < (byte *)((long)&local_10[0]->used + sVar4)) {
            return 0;
          }
          iVar2 = mp_read_unsigned_bin
                            (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80,iVar1);
          if (iVar2 != 0) {
            return 0;
          }
          local_10[0] = (mp_int *)((long)&local_10[0]->used + sVar4);
        }
        if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 0) &&
           ((local_10[0]->used & 0x1f) == 2)) {
          local_10[0] = (mp_int *)((long)&local_10[0]->used + 1);
          sVar4 = _parse_length((uchar **)local_10);
          if (pbVar3 < (byte *)((long)&local_10[0]->used + sVar4)) {
            return 0;
          }
          iVar1 = mp_read_unsigned_bin
                            (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80,iVar1);
          if (iVar1 != 0) {
            return 0;
          }
          local_10[0] = (mp_int *)((long)&local_10[0]->used + sVar4);
        }
      }
    }
    if ((((int)(uint)(byte)local_10[0]->used >> 5 & 1U) == 0) && ((local_10[0]->used & 0x1f) == 3))
    {
      pmVar5 = (mp_int *)((long)&local_10[0]->used + 1);
      local_10[0] = pmVar5;
      sVar4 = _parse_length((uchar **)local_10);
      if (pbVar3 < (byte *)((long)&pmVar5->used + sVar4)) {
        return 0;
      }
      pbVar6 = (byte *)((long)&local_10[0]->used + 1);
      if ((byte)local_10[0]->used != 0) {
        return 0;
      }
      if ((((int)(uint)*pbVar6 >> 5 & 1U) == 0) && ((*pbVar6 & 0x1f) == 2)) {
        local_10[0] = (mp_int *)((long)&local_10[0]->used + 2);
        sVar4 = _parse_length((uchar **)local_10);
        if (pbVar3 < (byte *)((long)&local_10[0]->used + sVar4)) {
          return 0;
        }
        iVar1 = mp_read_unsigned_bin
                          (in_stack_ffffffffffffff88,(uchar *)in_stack_ffffffffffffff80,
                           (int)((ulong)pmVar5 >> 0x20));
        return (uint)(iVar1 == 0);
      }
    }
  }
  return 0;
}

Assistant:

int parse_der_pubkey(const unsigned char* der, size_t len, mp_int* keyP, mp_int* keyQ, mp_int* keyG, mp_int* keyY)
{
	static unsigned char ansi_x9_57[] = { 0x2A, 0x86, 0x48, 0xCE, 0x38, 0x04, 0x01 };
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		SEQUENCE
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			OBJECT_IDENTIFIER
			{
				der++;
				size_t length = _parse_length(&der);

				if (length != sizeof(ansi_x9_57) || (length == sizeof(ansi_x9_57) && memcmp(der, ansi_x9_57, length) != 0))
					return 0;

				der += length;
			}

			SEQUENCE
			{
				if ((++der + _parse_length(&der)) > end)
					return 0;

				INTEGER
				{
					// p
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyP, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// q
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyQ, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// g
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyG, der, length) != MP_OKAY)
						return 0;

					der += length;
				}
			}
		}

		BIT_STRING
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			if (*der++ != 0)
				return 0;

			INTEGER
			{
				// y
				der++;
				size_t length = _parse_length(&der);

				if ((der + length) > end)
					return 0;

				return (mp_read_unsigned_bin(keyY, der, length) == MP_OKAY);
			}
		}
	}

	return 0;
}